

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void testing::internal::DeathTestAbort(string *message)

{
  InternalRunDeathTestFlag *pIVar1;
  UnitTestImpl *pUVar2;
  FILE *__stream;
  
  pUVar2 = GetUnitTestImpl();
  pIVar1 = (pUVar2->internal_run_death_test_flag_).ptr_;
  if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
    fputs((message->_M_dataplus)._M_p,_stderr);
    fflush(_stderr);
    abort();
  }
  __stream = (FILE *)posix::FDOpen(pIVar1->write_fd_,"w");
  fputc(0x49,__stream);
  fputs((message->_M_dataplus)._M_p,__stream);
  fflush(__stream);
  _exit(1);
}

Assistant:

static void DeathTestAbort(const std::string& message) {
  // On a POSIX system, this function may be called from a threadsafe-style
  // death test child process, which operates on a very small stack.  Use
  // the heap for any additional non-minuscule memory requirements.
  const InternalRunDeathTestFlag* const flag =
      GetUnitTestImpl()->internal_run_death_test_flag();
  if (flag != NULL) {
    FILE* parent = posix::FDOpen(flag->write_fd(), "w");
    fputc(kDeathTestInternalError, parent);
    fprintf(parent, "%s", message.c_str());
    fflush(parent);
    _exit(1);
  } else {
    fprintf(stderr, "%s", message.c_str());
    fflush(stderr);
    posix::Abort();
  }
}